

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.hpp
# Opt level: O2

void boost::algorithm::trim_left_if<std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input,
               is_any_ofF<char> *IsSpace)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  InBegin;
  size_type sVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  is_any_ofF<char> iStack_38;
  
  InBegin._M_current = (Input->_M_dataplus)._M_p;
  sVar1 = Input->_M_string_length;
  detail::is_any_ofF<char>::is_any_ofF(&iStack_38,IsSpace);
  _Var2 = detail::
          trim_begin<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,boost::algorithm::detail::is_any_ofF<char>>
                    (InBegin,InBegin._M_current + sVar1,&iStack_38);
  std::__cxx11::string::erase(Input,InBegin._M_current,_Var2._M_current);
  detail::is_any_ofF<char>::~is_any_ofF(&iStack_38);
  return;
}

Assistant:

inline void trim_left_if(SequenceT& Input, PredicateT IsSpace)
        {
            Input.erase( 
                ::boost::begin(Input),
                ::boost::algorithm::detail::trim_begin( 
                    ::boost::begin(Input), 
                    ::boost::end(Input), 
                    IsSpace));
        }